

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task28.cpp
# Opt level: O2

bool is_sort(vector<int,_std::allocator<int>_> *arr,int len,Order type)

{
  int *piVar1;
  pointer piVar2;
  long lVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  
  lVar5 = (long)len;
  if (type == DESC) {
    lVar6 = 1;
    do {
      bVar4 = lVar5 <= lVar6;
      if (lVar5 <= lVar6) {
        return bVar4;
      }
      piVar2 = (arr->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_start;
      lVar3 = lVar6 + -1;
      piVar1 = piVar2 + lVar6;
      lVar6 = lVar6 + 1;
    } while (*piVar1 <= piVar2[lVar3]);
  }
  else {
    lVar6 = 1;
    do {
      bVar4 = lVar5 <= lVar6;
      if (lVar5 <= lVar6) {
        return bVar4;
      }
      piVar2 = (arr->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_start;
      lVar3 = lVar6 + -1;
      piVar1 = piVar2 + lVar6;
      lVar6 = lVar6 + 1;
    } while (piVar2[lVar3] <= *piVar1);
  }
  return bVar4;
}

Assistant:

bool is_sort(vector<int> arr, int len, Order type){
    switch (type) {
        case DESC:
            for (int i = 1; i < len; i++) {
                if (arr[i - 1] < arr[i]) {
                    return false;
                }
            }
            return true;
        case ABC:
            for (int i = 1; i < len; i++) {
                if (arr[i - 1] > arr[i]) {
                    return false;
                }
            }
            return true;
    }
}